

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall
QMenuSloppyState::setSubMenuPopup
          (QMenuSloppyState *this,QRect *actionRect,QAction *resetAction,QMenu *subMenu)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  Data *pDVar4;
  Data *pDVar6;
  
  this->m_init_guard = true;
  this->field_0x6c = this->field_0x6c | 0x21;
  QBasicTimer::stop();
  iVar1 = (actionRect->x2).m_i;
  iVar2 = (actionRect->y2).m_i;
  uVar3 = actionRect->x1;
  uVar5 = actionRect->y1;
  (this->m_action_rect).xp = (double)(int)uVar3;
  (this->m_action_rect).yp = (double)(int)uVar5;
  (this->m_action_rect).w = (double)(((long)iVar1 - (long)(int)uVar3) + 1);
  (this->m_action_rect).h = (double)(((long)iVar2 - (long)(int)uVar5) + 1);
  pDVar6 = (this->m_sub_menu).wp.d;
  if (((pDVar6 != (Data *)0x0) && (*(int *)(pDVar6 + 4) != 0)) &&
     ((this->m_sub_menu).wp.value != (QObject *)0x0)) {
    *(undefined8 *)(*(long *)((this->m_sub_menu).wp.value + 8) + 0x380) = 0;
  }
  if (subMenu == (QMenu *)0x0) {
    pDVar6 = (Data *)0x0;
  }
  else {
    pDVar6 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)subMenu);
  }
  pDVar4 = (this->m_sub_menu).wp.d;
  (this->m_sub_menu).wp.d = pDVar6;
  (this->m_sub_menu).wp.value = (QObject *)subMenu;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      operator_delete(pDVar4);
    }
  }
  *(QMenuSloppyState **)(*(long *)&(subMenu->super_QWidget).field_0x8 + 0x380) = this;
  this->m_reset_action = resetAction;
  this->m_origin_action = resetAction;
  return;
}

Assistant:

void QMenuSloppyState::setSubMenuPopup(const QRect &actionRect, QAction *resetAction, QMenu *subMenu)
{
    m_enabled = true;
    m_init_guard = true;
    m_use_reset_action = true;
    m_time.stop();
    m_action_rect = actionRect;
    if (m_sub_menu)
        QMenuPrivate::get(m_sub_menu)->sloppyState.m_parent = nullptr;
    m_sub_menu = subMenu;
    QMenuPrivate::get(subMenu)->sloppyState.m_parent = this;
    m_reset_action = resetAction;
    m_origin_action = resetAction;
}